

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-coloring.cpp
# Opt level: O1

void __thiscall
msdfgen::edgeColoringSimple
          (msdfgen *this,Shape *shape,double angleThreshold,unsigned_long_long seed)

{
  pointer pEVar1;
  pointer pEVar2;
  EdgeHolder *pEVar3;
  Shape *pSVar4;
  EdgeColor EVar5;
  EdgeColor EVar6;
  uint uVar7;
  EdgeSegment *pEVar8;
  long *plVar9;
  int iVar10;
  EdgeHolder *this_00;
  double *pdVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  int m;
  int iVar16;
  EdgeHolder *pEVar17;
  int iVar18;
  vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> *this_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double in_XMM1_Qa;
  Vector2 VVar19;
  EdgeColor colors [3];
  int index;
  vector<int,_std::allocator<int>_> corners;
  EdgeSegment *parts [7];
  Shape *local_e8;
  Vector2 local_e0;
  int local_cc;
  int *local_c8;
  iterator iStack_c0;
  int *local_b8;
  double local_a8;
  int local_a0;
  EdgeColor local_9c;
  Vector2 local_98;
  long local_88 [5];
  Vector2 local_60;
  msdfgen *local_50;
  double local_48;
  Vector2 local_40;
  
  local_48 = sin(angleThreshold);
  local_c8 = (int *)0x0;
  iStack_c0._M_current = (int *)0x0;
  local_b8 = (int *)0x0;
  this_01 = *(vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> **)this;
  local_50 = this;
  if (this_01 != *(vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> **)(this + 8))
  {
    do {
      if (iStack_c0._M_current != local_c8) {
        iStack_c0._M_current = local_c8;
      }
      if ((this_01->super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (this_01->super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        pEVar8 = EdgeHolder::operator->
                           ((this_01->
                            super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1);
        (*pEVar8->_vptr_EdgeSegment[4])(0,pEVar8);
        local_98.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_98.y = in_XMM1_Qa;
        local_cc = 0;
        for (pEVar17 = (this_01->
                       super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                       )._M_impl.super__Vector_impl_data._M_start; local_98.y = in_XMM1_Qa,
            pEVar17 !=
            (this_01->super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>)
            ._M_impl.super__Vector_impl_data._M_finish; pEVar17 = pEVar17 + 1) {
          VVar19 = Vector2::normalize(&local_98,false);
          dVar15 = VVar19.y;
          local_e0.x = VVar19.x;
          local_e0.y = dVar15;
          pEVar8 = EdgeHolder::operator->(pEVar17);
          (*pEVar8->_vptr_EdgeSegment[4])(0,pEVar8);
          local_40.y = dVar15;
          VVar19 = Vector2::normalize(&local_40,false);
          local_60.y = VVar19.y;
          local_60.x = VVar19.x;
          dVar15 = dotProduct(&local_e0,&local_60);
          in_XMM1_Qa = 0.0;
          if ((dVar15 <= 0.0) ||
             (dVar15 = crossProduct(&local_e0,&local_60), local_48 < ABS(dVar15))) {
            if (iStack_c0._M_current == local_b8) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_c8,iStack_c0,&local_cc);
            }
            else {
              *iStack_c0._M_current = local_cc;
              iStack_c0._M_current = iStack_c0._M_current + 1;
            }
          }
          pEVar8 = EdgeHolder::operator->(pEVar17);
          (*pEVar8->_vptr_EdgeSegment[4])(0,pEVar8);
          local_98.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
          local_cc = local_cc + 1;
          local_98.y = in_XMM1_Qa;
        }
      }
      if (local_c8 == iStack_c0._M_current) {
        for (pEVar17 = (this_01->
                       super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                       )._M_impl.super__Vector_impl_data._M_start; pSVar4 = shape,
            pEVar17 !=
            (this_01->super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>)
            ._M_impl.super__Vector_impl_data._M_finish; pEVar17 = pEVar17 + 1) {
          pEVar8 = EdgeHolder::operator->(pEVar17);
          pEVar8->color = WHITE;
        }
      }
      else if ((long)iStack_c0._M_current - (long)local_c8 == 4) {
        uVar14 = (ulong)shape / 3;
        EVar6 = *(EdgeColor *)
                 (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)::start +
                 ((ulong)shape % 3) * 4);
        local_e0.x = (double)CONCAT44(7,EVar6);
        if ((EVar6 == WHITE) || (EVar6 == BLACK)) {
          local_e8 = (Shape *)(uVar14 / 3);
          local_e0.y = (double)CONCAT44(local_e0.y._4_4_,
                                        *(undefined4 *)
                                         (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)
                                          ::start + (uVar14 % 3) * 4));
        }
        else {
          uVar7 = EVar6 << ((byte)uVar14 & 1) + 1;
          local_e0.y = (double)(CONCAT44(local_e0.y._4_4_,uVar7 >> 3 | uVar7) & 0xffffffff00000007);
          local_e8 = (Shape *)(uVar14 >> 1);
        }
        iVar18 = *local_c8;
        pEVar1 = (this_01->
                 super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pEVar2 = (this_01->
                 super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        uVar14 = (long)pEVar2 - (long)pEVar1 >> 3;
        pSVar4 = local_e8;
        if (uVar14 < 3) {
          if (pEVar2 != pEVar1) {
            local_88[2] = 0;
            local_88[3] = 0;
            local_88[0] = 0;
            local_88[1] = 0;
            local_98.x = 0.0;
            local_98.y = 0.0;
            local_88[4] = 0;
            pEVar8 = EdgeHolder::operator->
                               ((this_01->
                                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                )._M_impl.super__Vector_impl_data._M_start);
            (*pEVar8->_vptr_EdgeSegment[10])
                      (pEVar8,(long)&local_98 + (long)iVar18 * 0x18,&local_98.y + iVar18 * 3,
                       local_88 + iVar18 * 3);
            pEVar1 = (this_01->
                     super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this_01->
                              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) < 9) {
              *(EdgeColor *)((long)local_98.x + 8) = EVar6;
              *(undefined4 *)((long)local_98.y + 8) = local_e0.x._4_4_;
              plVar9 = local_88;
            }
            else {
              pEVar8 = EdgeHolder::operator->(pEVar1 + 1);
              (*pEVar8->_vptr_EdgeSegment[10])
                        (pEVar8,&local_98.x + (iVar18 * -3 + 3),&local_98.x + (iVar18 * -3 + 4),
                         &local_98.x + (iVar18 * -3 + 5));
              *(EdgeColor *)((long)local_98.y + 8) = EVar6;
              *(EdgeColor *)((long)local_98.x + 8) = EVar6;
              *(undefined4 *)(local_88[1] + 8) = local_e0.x._4_4_;
              *(undefined4 *)(local_88[0] + 8) = local_e0.x._4_4_;
              *(undefined4 *)(local_88[3] + 8) = local_e0.y._0_4_;
              plVar9 = local_88 + 2;
            }
            *(undefined4 *)(*plVar9 + 8) = local_e0.y._0_4_;
            pEVar17 = (this_01->
                      super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar3 = (this_01->
                     super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            this_00 = pEVar17;
            if (pEVar3 != pEVar17) {
              do {
                EdgeHolder::~EdgeHolder(this_00);
                this_00 = this_00 + 1;
              } while (this_00 != pEVar3);
              (this_01->
              super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>)._M_impl
              .super__Vector_impl_data._M_finish = pEVar17;
            }
            pdVar11 = &local_98.y;
            pEVar8 = (EdgeSegment *)local_98.x;
            while (pSVar4 = local_e8, pEVar8 != (EdgeSegment *)0x0) {
              EdgeHolder::EdgeHolder((EdgeHolder *)&local_60,pEVar8);
              std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
              emplace_back<msdfgen::EdgeHolder>(this_01,(EdgeHolder *)&local_60);
              EdgeHolder::~EdgeHolder((EdgeHolder *)&local_60);
              pEVar8 = (EdgeSegment *)*pdVar11;
              pdVar11 = pdVar11 + 1;
            }
          }
        }
        else {
          iVar16 = (int)uVar14;
          if (0 < iVar16) {
            local_a8 = (double)(iVar16 + -1);
            iVar10 = 0;
            do {
              EVar6 = *(EdgeColor *)
                       ((long)&local_e8 +
                       (long)(int)(((double)iVar10 * 2.875) / local_a8 + 3.0 + -1.4375 + 0.5) * 4);
              pEVar8 = EdgeHolder::operator->
                                 ((this_01->
                                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                  )._M_impl.super__Vector_impl_data._M_start +
                                  (iVar18 + iVar10) % iVar16);
              pEVar8->color = EVar6;
              iVar10 = iVar10 + 1;
              pSVar4 = local_e8;
            } while (iVar16 != iVar10);
          }
        }
      }
      else {
        dVar15 = (double)((ulong)((long)(this_01->
                                        super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this_01->
                                       super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 3);
        local_e8 = (Shape *)((ulong)shape / 3);
        pSVar4 = local_e8;
        if (0 < SUB84(dVar15,0)) {
          iVar18 = *local_c8;
          EVar6 = *(EdgeColor *)
                   (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)::start +
                   ((ulong)shape % 3) * 4);
          iVar16 = (int)((ulong)((long)iStack_c0._M_current - (long)local_c8) >> 2);
          local_a0 = iVar16 + -2;
          iVar10 = 0;
          uVar14 = (ulong)dVar15 & 0xffffffff;
          local_a8 = dVar15;
          local_9c = EVar6;
          do {
            iVar13 = iVar18 % SUB84(local_a8,0);
            iVar12 = iVar10 + 1;
            if ((iVar12 < iVar16) && (local_c8[iVar12] == iVar13)) {
              EVar5 = BLACK;
              if (iVar10 == local_a0) {
                EVar5 = local_9c;
              }
              EVar5 = EVar5 & EVar6;
              iVar10 = iVar12;
              if ((EVar5 < MAGENTA) && ((0x16U >> (EVar5 & 0x1f) & 1) != 0)) {
                EVar6 = EVar5 ^ WHITE;
              }
              else if ((EVar6 == WHITE) || (EVar6 == BLACK)) {
                EVar6 = *(EdgeColor *)
                         (switchColor(msdfgen::EdgeColor&,unsigned_long_long&,msdfgen::EdgeColor)::
                          start + ((ulong)local_e8 % 3) * 4);
                local_e8 = (Shape *)((ulong)local_e8 / 3);
              }
              else {
                EVar6 = EVar6 << ((byte)local_e8 & 1) + 1;
                EVar6 = (EVar6 >> 3 | EVar6) & WHITE;
                local_e8 = (Shape *)((ulong)local_e8 >> 1);
              }
            }
            pEVar8 = EdgeHolder::operator->
                               ((this_01->
                                super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                                )._M_impl.super__Vector_impl_data._M_start + iVar13);
            pEVar8->color = EVar6;
            iVar18 = iVar18 + 1;
            uVar7 = (int)uVar14 - 1;
            uVar14 = (ulong)uVar7;
            pSVar4 = local_e8;
          } while (uVar7 != 0);
        }
      }
      local_e8 = pSVar4;
      this_01 = this_01 + 1;
      shape = local_e8;
    } while (this_01 !=
             *(vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_> **)(local_50 + 8));
  }
  if (local_c8 != (int *)0x0) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void edgeColoringSimple(Shape &shape, double angleThreshold, unsigned long long seed) {
    double crossThreshold = sin(angleThreshold);
    std::vector<int> corners;
    for (std::vector<Contour>::iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour) {
        // Identify corners
        corners.clear();
        if (!contour->edges.empty()) {
            Vector2 prevDirection = (*(contour->edges.end()-1))->direction(1);
            int index = 0;
            for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge, ++index) {
                if (isCorner(prevDirection.normalize(), (*edge)->direction(0).normalize(), crossThreshold))
                    corners.push_back(index);
                prevDirection = (*edge)->direction(1);
            }
        }

        // Smooth contour
        if (corners.empty())
            for (std::vector<EdgeHolder>::iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge)
                (*edge)->color = WHITE;
        // "Teardrop" case
        else if (corners.size() == 1) {
            EdgeColor colors[3] = { WHITE, WHITE };
            switchColor(colors[0], seed);
            switchColor(colors[2] = colors[0], seed);
            int corner = corners[0];
            if (contour->edges.size() >= 3) {
                int m = contour->edges.size();
                for (int i = 0; i < m; ++i)
                    contour->edges[(corner+i)%m]->color = (colors+1)[int(3+2.875*i/(m-1)-1.4375+.5)-3];
            } else if (contour->edges.size() >= 1) {
                // Less than three edge segments for three colors => edges must be split
                EdgeSegment *parts[7] = { };
                contour->edges[0]->splitInThirds(parts[0+3*corner], parts[1+3*corner], parts[2+3*corner]);
                if (contour->edges.size() >= 2) {
                    contour->edges[1]->splitInThirds(parts[3-3*corner], parts[4-3*corner], parts[5-3*corner]);
                    parts[0]->color = parts[1]->color = colors[0];
                    parts[2]->color = parts[3]->color = colors[1];
                    parts[4]->color = parts[5]->color = colors[2];
                } else {
                    parts[0]->color = colors[0];
                    parts[1]->color = colors[1];
                    parts[2]->color = colors[2];
                }
                contour->edges.clear();
                for (int i = 0; parts[i]; ++i)
                    contour->edges.push_back(EdgeHolder(parts[i]));
            }
        }
        // Multiple corners
        else {
            int cornerCount = corners.size();
            int spline = 0;
            int start = corners[0];
            int m = contour->edges.size();
            EdgeColor color = WHITE;
            switchColor(color, seed);
            EdgeColor initialColor = color;
            for (int i = 0; i < m; ++i) {
                int index = (start+i)%m;
                if (spline+1 < cornerCount && corners[spline+1] == index) {
                    ++spline;
                    switchColor(color, seed, EdgeColor((spline == cornerCount-1)*initialColor));
                }
                contour->edges[index]->color = color;
            }
        }
    }
}